

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O1

Vec_Int_t * Llb_ManComputeBaseCase(Aig_Man_t *p,DdManager *dd)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = *p->vCos->pArray;
  iVar1 = p->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 * 4);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar8];
      if ((pvVar3 != (void *)0x0) &&
         ((uVar4 = *(uint *)((long)pvVar3 + 0x18) & 7, uVar4 == 2 || (uVar4 - 5 < 2)))) {
        iVar5 = Cudd_bddLeq(dd,*(DdNode **)((long)pvVar3 + 0x28),
                            (DdNode *)(*(ulong *)((long)pvVar2 + 0x28) ^ 1));
        if (iVar5 == 0) {
          iVar5 = Cudd_bddLeq(dd,(DdNode *)(*(ulong *)((long)pvVar3 + 0x28) ^ 1),
                              (DdNode *)(*(ulong *)((long)pvVar2 + 0x28) ^ 1));
          if (iVar5 == 0) goto LAB_00934d50;
          iVar5 = 0;
        }
        else {
          iVar5 = 1;
        }
        if (iVar1 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar8] = iVar5;
      }
LAB_00934d50:
      lVar8 = lVar8 + 1;
      pVVar7 = p->vObjs;
    } while (lVar8 < pVVar7->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Llb_ManComputeBaseCase( Aig_Man_t * p, DdManager * dd )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj, * pRoot;
    int i;
    pRoot = Aig_ManCo( p, 0 );
    vNodes = Vec_IntStartFull( Aig_ManObjNumMax(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Cudd_bddLeq( dd, (DdNode *)pObj->pData, Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 1 );
        else if ( Cudd_bddLeq( dd, Cudd_Not((DdNode *)pObj->pData), Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 0 );
    }
    return vNodes;
}